

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_erase_range_of_elements_Test::TestBody
          (VectorSUnitTest_erase_range_of_elements_Test *this)

{
  bool bVar1;
  char *pcVar2;
  iterator pvVar3;
  iterator pvVar4;
  reference pvVar5;
  AssertHelper local_518;
  Message local_510;
  uint local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_26;
  Message local_4e8;
  uint local_4dc;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_25;
  Message local_4c0;
  uint local_4b4;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_24;
  Message local_498;
  size_type local_490;
  uint local_484;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_23;
  Message local_468;
  iterator local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_22;
  iterator it3;
  Message local_438;
  uint local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_21;
  Message local_410;
  uint local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_20;
  Message local_3e8;
  uint local_3dc;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_19;
  Message local_3c0;
  uint local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_18;
  Message local_398;
  uint local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_17;
  Message local_370;
  uint local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_16;
  Message local_348;
  size_type local_340;
  uint local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_15;
  Message local_318;
  uint local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_14;
  Message local_2f0;
  iterator local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_13;
  iterator it2;
  Message local_2c0;
  uint local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_12;
  Message local_298;
  uint local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_11;
  Message local_270;
  uint local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_10;
  Message local_248;
  uint local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_9;
  Message local_220;
  uint local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_8;
  Message local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_7;
  Message local_1d0;
  uint local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_6;
  Message local_1a8;
  uint local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_5;
  Message local_180;
  uint local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_4;
  Message local_158;
  size_type local_150;
  uint local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  Message local_128;
  uint local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  iterator local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  iterator it1;
  Message local_d0 [3];
  size_type local_b8;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  initializer_list<unsigned_int> local_60;
  undefined1 local_50 [8];
  vector_s<unsigned_int,_12UL> v;
  VectorSUnitTest_erase_range_of_elements_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  local_60._M_array = (iterator)&gtest_ar.message_;
  local_60._M_len = 0xc;
  v.data_ptr_ = (pointer)this;
  estl::vector_s<unsigned_int,_12UL>::vector_s((vector_s<unsigned_int,_12UL> *)local_50,&local_60);
  local_ac = 0xc;
  local_b8 = estl::vector_s<unsigned_int,_12UL>::size((vector_s<unsigned_int,_12UL> *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a8,"12u","v.size()",&local_ac,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x31e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it1,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it1);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pvVar3 = estl::vector_s<unsigned_int,_12UL>::begin((vector_s<unsigned_int,_12UL> *)local_50);
  pvVar4 = estl::vector_s<unsigned_int,_12UL>::begin((vector_s<unsigned_int,_12UL> *)local_50);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )estl::vector_s<unsigned_int,_12UL>::erase
                   ((vector_s<unsigned_int,_12UL> *)local_50,pvVar3,pvVar4 + 3);
  local_f8 = estl::vector_s<unsigned_int,_12UL>::begin((vector_s<unsigned_int,_12UL> *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int_*,_unsigned_int_*,_nullptr>
            ((EqHelper *)local_f0,"v.begin()","it1",&local_f8,(uint **)&gtest_ar_1.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x322,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_11c = 3;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_118,"3u","*it1",&local_11c,
             (uint *)gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x323,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_144 = 9;
  local_150 = estl::vector_s<unsigned_int,_12UL>::size((vector_s<unsigned_int,_12UL> *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_140,"9u","v.size()",&local_144,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x324,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_174 = 3;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_170,"3u","v[0]",&local_174,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x325,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_19c = 4;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_198,"4u","v[1]",&local_19c,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x326,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1c4 = 5;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1c0,"5u","v[2]",&local_1c4,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x327,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_1ec = 6;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1e8,"6u","v[3]",&local_1ec,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x328,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_214 = 7;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_210,"7u","v[4]",&local_214,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x329,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_23c = 8;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,5);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_238,"8u","v[5]",&local_23c,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_264 = 9;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_260,"9u","v[6]",&local_264,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_28c = 10;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,7);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_288,"10u","v[7]",&local_28c,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2b4 = 0xb;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2b0,"11u","v[8]",&local_2b4,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it2,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it2);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  pvVar3 = estl::vector_s<unsigned_int,_12UL>::begin((vector_s<unsigned_int,_12UL> *)local_50);
  pvVar4 = estl::vector_s<unsigned_int,_12UL>::begin((vector_s<unsigned_int,_12UL> *)local_50);
  gtest_ar_13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )estl::vector_s<unsigned_int,_12UL>::erase
                   ((vector_s<unsigned_int,_12UL> *)local_50,pvVar3 + 3,pvVar4 + 6);
  local_2e8 = estl::vector_s<unsigned_int,_12UL>::begin((vector_s<unsigned_int,_12UL> *)local_50);
  local_2e8 = local_2e8 + 3;
  testing::internal::EqHelper::Compare<unsigned_int_*,_unsigned_int_*,_nullptr>
            ((EqHelper *)local_2e0,"v.begin()+3","it2",&local_2e8,(uint **)&gtest_ar_13.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x331,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_30c = 9;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_308,"9u","*it2",&local_30c,
             (uint *)gtest_ar_13.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x332,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_334 = 6;
  local_340 = estl::vector_s<unsigned_int,_12UL>::size((vector_s<unsigned_int,_12UL> *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_330,"6u","v.size()",&local_334,&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x333,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_364 = 3;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_360,"3u","v[0]",&local_364,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x334,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  local_38c = 4;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_388,"4u","v[1]",&local_38c,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x335,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  local_3b4 = 5;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_3b0,"5u","v[2]",&local_3b4,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x336,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  local_3dc = 9;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_3d8,"9u","v[3]",&local_3dc,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x337,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_404 = 10;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_400,"10u","v[4]",&local_404,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x338,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  local_42c = 0xb;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,5);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_428,"11u","v[5]",&local_42c,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x339,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it3,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it3);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  pvVar3 = estl::vector_s<unsigned_int,_12UL>::end((vector_s<unsigned_int,_12UL> *)local_50);
  pvVar4 = estl::vector_s<unsigned_int,_12UL>::end((vector_s<unsigned_int,_12UL> *)local_50);
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )estl::vector_s<unsigned_int,_12UL>::erase
                   ((vector_s<unsigned_int,_12UL> *)local_50,pvVar3 + -3,pvVar4);
  local_460 = estl::vector_s<unsigned_int,_12UL>::end((vector_s<unsigned_int,_12UL> *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int_*,_unsigned_int_*,_nullptr>
            ((EqHelper *)local_458,"v.end()","it3",&local_460,(uint **)&gtest_ar_22.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x33d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  local_484 = 3;
  local_490 = estl::vector_s<unsigned_int,_12UL>::size((vector_s<unsigned_int,_12UL> *)local_50);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_480,"3u","v.size()",&local_484,&local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x33e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  local_4b4 = 3;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_4b0,"3u","v[0]",&local_4b4,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x33f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4dc = 4;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_4d8,"4u","v[1]",&local_4dc,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x340,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_504 = 5;
  pvVar5 = estl::vector_s<unsigned_int,_12UL>::operator[]
                     ((vector_s<unsigned_int,_12UL> *)local_50,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_500,"5u","v[2]",&local_504,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x341,pcVar2);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  estl::vector_s<unsigned_int,_12UL>::~vector_s((vector_s<unsigned_int,_12UL> *)local_50);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, erase_range_of_elements)
{
    vector_s<unsigned, 12> v{0u, 1u, 2u, 3u, 4u, 5u, 6u, 7u, 8u, 9u, 10u, 11u};
    EXPECT_EQ(12u, v.size());

    // Erase 3 elements from the beginning
    const auto it1 = v.erase(v.begin(), v.begin() +3);
    EXPECT_EQ(v.begin(), it1);
    EXPECT_EQ(3u, *it1);
    EXPECT_EQ(9u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
    EXPECT_EQ(6u, v[3]);
    EXPECT_EQ(7u, v[4]);
    EXPECT_EQ(8u, v[5]);
    EXPECT_EQ(9u, v[6]);
    EXPECT_EQ(10u, v[7]);
    EXPECT_EQ(11u, v[8]);

    // Erase 3 elements from the middle
    const auto it2 = v.erase(v.begin()+3, v.begin()+6);
    EXPECT_EQ(v.begin()+3, it2);
    EXPECT_EQ(9u, *it2);
    EXPECT_EQ(6u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
    EXPECT_EQ(9u, v[3]);
    EXPECT_EQ(10u, v[4]);
    EXPECT_EQ(11u, v[5]);

    // Erase 3 last element
    const auto it3 = v.erase(v.end()-3, v.end());
    EXPECT_EQ(v.end(), it3);
    EXPECT_EQ(3u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
}